

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void run_game_loop(void)

{
  bool bVar1;
  duration<double,_std::ratio<1L,_1000L>_> local_30;
  cell_map local_28;
  
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&stop_game_thread);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    next_generation(&local_28,&grid);
    cell_map::operator=(&grid,&local_28);
    cell_map::~cell_map(&local_28);
    paint_grid();
    std::chrono::duration<double,std::ratio<1l,1000l>>::duration<std::atomic<double>,void>
              ((duration<double,std::ratio<1l,1000l>> *)&local_30,&game_sleep_time);
    std::this_thread::sleep_for<double,std::ratio<1l,1000l>>(&local_30);
  }
  return;
}

Assistant:

void run_game_loop()
  {
  while (!stop_game_thread)
    {
    grid = next_generation(grid);
    paint_grid();
    std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(game_sleep_time));
    }
  }